

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::Version::~Version(Version *this)

{
  int iVar1;
  long lVar2;
  Version *pVVar3;
  Version *pVVar4;
  FileMetaData *pFVar5;
  pointer pcVar6;
  void *pvVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer ppFVar9;
  pointer ppFVar10;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->refs_ != 0) {
    __assert_fail("refs_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x45,"leveldb::Version::~Version()");
  }
  pVVar3 = this->next_;
  pVVar4 = this->prev_;
  pVVar4->next_ = pVVar3;
  pVVar3->prev_ = pVVar4;
  lVar12 = 0;
  do {
    ppFVar9 = this->files_[lVar12].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar10 = this->files_[lVar12].
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar10 != ppFVar9) {
      uVar11 = 0;
      do {
        pFVar5 = ppFVar9[uVar11];
        iVar1 = pFVar5->refs;
        if (iVar1 < 1) {
          __assert_fail("f->refs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                        ,0x4f,"leveldb::Version::~Version()");
        }
        pFVar5->refs = iVar1 + -1;
        if (iVar1 == 1) {
          pcVar6 = (pFVar5->largest).rep_._M_dataplus._M_p;
          paVar8 = &(pFVar5->largest).rep_.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar6 != paVar8) {
            operator_delete(pcVar6,paVar8->_M_allocated_capacity + 1);
          }
          pcVar6 = (pFVar5->smallest).rep_._M_dataplus._M_p;
          paVar8 = &(pFVar5->smallest).rep_.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar6 != paVar8) {
            operator_delete(pcVar6,paVar8->_M_allocated_capacity + 1);
          }
          operator_delete(pFVar5,0x58);
          ppFVar9 = this->files_[lVar12].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppFVar10 = this->files_[lVar12].
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)((long)ppFVar10 - (long)ppFVar9 >> 3));
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 7);
  lVar12 = 0xc0;
  do {
    pvVar7 = *(void **)((long)(this->files_ + -2) + lVar12);
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,*(long *)((long)this->files_ + lVar12 + -0x20) - (long)pvVar7);
    }
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != 0x18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Version::~Version() {
  assert(refs_ == 0);

  // Remove from linked list
  prev_->next_ = next_;
  next_->prev_ = prev_;

  // Drop references to files
  for (int level = 0; level < config::kNumLevels; level++) {
    for (size_t i = 0; i < files_[level].size(); i++) {
      FileMetaData* f = files_[level][i];
      assert(f->refs > 0);
      f->refs--;
      if (f->refs <= 0) {
        delete f;
      }
    }
  }
}